

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O0

void __thiscall
PoolResource<48UL,_8UL>::Deallocate
          (PoolResource<48UL,_8UL> *this,void *p,size_t bytes,size_t alignment)

{
  long lVar1;
  bool bVar2;
  PoolResource<48UL,_8UL> *this_00;
  align_val_t in_RCX;
  void *in_RSI;
  long in_FS_OFFSET;
  size_t num_alignments;
  ListNode **in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsFreeListUsable(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (bVar2) {
    this_00 = (PoolResource<48UL,_8UL> *)NumElemAlignBytes((size_t)in_stack_ffffffffffffffa8);
    std::array<PoolResource<48UL,_8UL>::ListNode_*,_7UL>::operator[]
              ((array<PoolResource<48UL,_8UL>::ListNode_*,_7UL> *)this_00,(size_type)in_RSI);
    PlacementAddToList(this_00,in_RSI,in_stack_ffffffffffffffa8);
  }
  else {
    operator_delete(in_RSI,in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Deallocate(void* p, std::size_t bytes, std::size_t alignment) noexcept
    {
        if (IsFreeListUsable(bytes, alignment)) {
            const std::size_t num_alignments = NumElemAlignBytes(bytes);
            // put the memory block into the linked list. We can placement construct the FreeList
            // into the memory since we can be sure the alignment is correct.
            PlacementAddToList(p, m_free_lists[num_alignments]);
        } else {
            // Can't use the pool => forward deallocation to ::operator delete().
            ::operator delete (p, std::align_val_t{alignment});
        }
    }